

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessage<std::__cxx11::string,std::__cxx11::string>
                   (string *msg,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_00000020;
  string *in_stack_00000028;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  size_t num_args;
  string local_90 [48];
  string local_60 [56];
  undefined8 local_28;
  
  local_28 = 2;
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::vector
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             0x7e6f43);
  std::__cxx11::string::string(local_60,in_RDX);
  std::__cxx11::string::string(local_90,in_RCX);
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_60);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::~vector
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             in_RDX);
  return in_RDI;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}